

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Keno::fillKenoVector
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,Keno *this)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  byte bVar5;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_08;
  allocator_type local_3d2;
  allocator_type local_3d1;
  allocator_type local_3d0;
  allocator_type local_3cf;
  allocator_type local_3ce;
  allocator_type local_3cd;
  allocator_type local_3cc;
  allocator_type local_3cb;
  allocator_type local_3ca;
  allocator_type local_3c9;
  _Vector_base<double,_std::allocator<double>_> local_3c8;
  vector<double,_std::allocator<double>_> local_3b0;
  vector<double,_std::allocator<double>_> local_398;
  vector<double,_std::allocator<double>_> local_380;
  vector<double,_std::allocator<double>_> local_368;
  vector<double,_std::allocator<double>_> local_350;
  vector<double,_std::allocator<double>_> local_338;
  vector<double,_std::allocator<double>_> local_320;
  vector<double,_std::allocator<double>_> local_308;
  double local_2f0 [10];
  double local_2a0 [10];
  double local_250 [10];
  double local_200 [10];
  double local_1b0 [10];
  double local_160 [10];
  double local_110 [10];
  double local_c0 [10];
  double local_70 [10];
  
  bVar5 = 0;
  lVar2 = 10;
  pdVar3 = (double *)&DAT_001376e0;
  pdVar4 = local_70;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  __l._M_len = 10;
  __l._M_array = local_70;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_3c8,__l,&local_3c9);
  pdVar3 = (double *)&DAT_00137730;
  pdVar4 = local_c0;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_00._M_len = 10;
  __l_00._M_array = local_c0;
  std::vector<double,_std::allocator<double>_>::vector(&local_3b0,__l_00,&local_3ca);
  pdVar3 = (double *)&DAT_00137780;
  pdVar4 = local_110;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_01._M_len = 10;
  __l_01._M_array = local_110;
  std::vector<double,_std::allocator<double>_>::vector(&local_398,__l_01,&local_3cb);
  pdVar3 = (double *)&DAT_001377d0;
  pdVar4 = local_160;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_02._M_len = 10;
  __l_02._M_array = local_160;
  std::vector<double,_std::allocator<double>_>::vector(&local_380,__l_02,&local_3cc);
  pdVar3 = (double *)&DAT_00137820;
  pdVar4 = local_1b0;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_03._M_len = 10;
  __l_03._M_array = local_1b0;
  std::vector<double,_std::allocator<double>_>::vector(&local_368,__l_03,&local_3cd);
  pdVar3 = (double *)&DAT_00137870;
  pdVar4 = local_200;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_04._M_len = 10;
  __l_04._M_array = local_200;
  std::vector<double,_std::allocator<double>_>::vector(&local_350,__l_04,&local_3ce);
  pdVar3 = (double *)&DAT_001378c0;
  pdVar4 = local_250;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_05._M_len = 10;
  __l_05._M_array = local_250;
  std::vector<double,_std::allocator<double>_>::vector(&local_338,__l_05,&local_3cf);
  pdVar3 = (double *)&DAT_00137910;
  pdVar4 = local_2a0;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_06._M_len = 10;
  __l_06._M_array = local_2a0;
  std::vector<double,_std::allocator<double>_>::vector(&local_320,__l_06,&local_3d0);
  pdVar3 = (double *)&DAT_00137960;
  pdVar4 = local_2f0;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_07._M_len = 10;
  __l_07._M_array = local_2f0;
  std::vector<double,_std::allocator<double>_>::vector(&local_308,__l_07,&local_3d1);
  __l_08._M_len = 9;
  __l_08._M_array = (iterator)&local_3c8;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_08,&local_3d2);
  lVar2 = 0xc0;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)&local_3c8._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> Keno::fillKenoVector() {
	
	const std::vector<std::vector<double>>kenoVector{
				{10,90,0,0,0,0,0,0,0,0},                               //2 Numbers
				{10,20,180,0,0,0,0,0,0,0},							   //3 Numbers
				{0,20,110,200,0,0,0,0,0,0},                            //4 Numbers
				{0,10,40,250,800,0,0,0,0,0},                           //5 Numbers
				{0,10,20,80,450,2000,0,0,0,0},                         //6 Numbers
				{0,0,20,80,170,550,3000,0,0,0},                        //7 Numbers
				{0,0,20,30,120,200,1100,8000,0,0},                     //8 Numbers
				{0,0,10,30,70,170,650,2500,20000,0},                   //9 Numbers
				{0,0,10,20,40,110,300,1000,10000,50000},               //10 Number
	};

	return kenoVector;
}